

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_topal.c
# Opt level: O0

int gdImageTrueColorToPaletteSetMethod(gdImagePtr im,int method,int speed)

{
  int local_20;
  int speed_local;
  int method_local;
  gdImagePtr im_local;
  
  if (method == 3) {
    im_local._4_4_ = 0;
  }
  else {
    if ((-1 < method) && (method < 4)) {
      im->paletteQuantizationMethod = method;
      if ((speed < 0) || (local_20 = speed, 10 < speed)) {
        local_20 = 0;
      }
      im->paletteQuantizationSpeed = local_20;
    }
    im_local._4_4_ = 1;
  }
  return im_local._4_4_;
}

Assistant:

BGD_DECLARE(int) gdImageTrueColorToPaletteSetMethod (gdImagePtr im, int method, int speed)
{
#ifndef HAVE_LIBIMAGEQUANT
	if (method == GD_QUANT_LIQ) {
		return FALSE;
	}
#endif

	if (method >= GD_QUANT_DEFAULT && method <= GD_QUANT_LIQ) {
		im->paletteQuantizationMethod = method;

		if (speed < 0 || speed > 10) {
			speed = 0;
		}
		im->paletteQuantizationSpeed = speed;
	}
	return TRUE;
}